

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

real cnn::rand_normal(void)

{
  result_type rVar1;
  normal_distribution<float> distribution;
  result_type in_stack_ffffffffffffffe8;
  result_type in_stack_ffffffffffffffec;
  normal_distribution<float> *in_stack_fffffffffffffff0;
  
  std::normal_distribution<float>::normal_distribution
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  rVar1 = std::normal_distribution<float>::operator()
                    (in_stack_fffffffffffffff0,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return rVar1;
}

Assistant:

real rand_normal() {
  normal_distribution<real> distribution(0, 1);
  return distribution(*rndeng);
}